

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_gen_prime
              (mbedtls_mpi *X,size_t nbits,int dh_flag,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  ulong *puVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi Y;
  mbedtls_mpi_uint r;
  uchar buf [1024];
  mbedtls_mpi_uint local_468;
  void *local_460;
  mbedtls_mpi local_458;
  mbedtls_mpi_uint local_440;
  mbedtls_mpi local_438 [43];
  
  iVar3 = -4;
  if (nbits - 0x2001 < 0xffffffffffffe002) {
    return -4;
  }
  local_458.s = 1;
  local_458.n = 0;
  local_458.p = (mbedtls_mpi_uint *)0x0;
  uVar4 = ((nbits >> 6) + 1) - (ulong)((nbits & 0x3f) == 0);
  local_460 = p_rng;
  if (uVar4 < 0x81) {
    sVar5 = uVar4 * 8;
    iVar3 = (*f_rng)(p_rng,(uchar *)local_438,sVar5);
    if (iVar3 == 0) {
      iVar3 = mbedtls_mpi_read_binary(X,(uchar *)local_438,sVar5);
    }
  }
  if (iVar3 != 0) goto LAB_00109630;
  sVar5 = mbedtls_mpi_bitlen(X);
  if ((nbits <= sVar5 && sVar5 - nbits != 0) &&
     (iVar3 = mbedtls_mpi_shift_r(X,(sVar5 - nbits) + 1), iVar3 != 0)) goto LAB_00109630;
  mbedtls_mpi_set_bit(X,nbits - 1,'\x01');
  pvVar2 = local_460;
  puVar1 = X->p;
  uVar4 = *puVar1;
  *puVar1 = uVar4 | 1;
  if (dh_flag == 0) {
    do {
      iVar3 = mbedtls_mpi_is_prime(X,f_rng,pvVar2);
      if (iVar3 != -0xe) break;
      local_468 = 2;
      local_438[0].s = 1;
      local_438[0].n = 1;
      local_438[0].p = &local_468;
      iVar3 = mbedtls_mpi_add_mpi(X,X,local_438);
    } while (iVar3 == 0);
    goto LAB_00109630;
  }
  *puVar1 = uVar4 | 3;
  iVar3 = mbedtls_mpi_mod_int(&local_440,X,3);
  if (iVar3 != 0) goto LAB_00109630;
  if (local_440 == 1) {
    local_468 = 4;
LAB_001095e4:
    local_438[0].s = 1;
    local_438[0].n = 1;
    local_438[0].p = &local_468;
    iVar3 = mbedtls_mpi_add_mpi(X,X,local_438);
    if (iVar3 != 0) goto LAB_00109630;
  }
  else if (local_440 == 0) {
    local_468 = 8;
    goto LAB_001095e4;
  }
  iVar3 = mbedtls_mpi_copy(&local_458,X);
  if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_shift_r(&local_458,1), iVar3 == 0)) {
    do {
      iVar3 = mpi_check_small_factors(X);
      if (((iVar3 == 0) &&
          (iVar3 = mpi_check_small_factors(&local_458), pvVar2 = local_460, iVar3 == 0)) &&
         (iVar3 = mpi_miller_rabin(X,f_rng,local_460), iVar3 == 0)) {
        iVar3 = mpi_miller_rabin(&local_458,f_rng,pvVar2);
      }
      if (iVar3 != -0xe) break;
      local_468 = 0xc;
      local_438[0].s = 1;
      local_438[0].n = 1;
      local_438[0].p = &local_468;
      iVar3 = mbedtls_mpi_add_mpi(X,X,local_438);
      if (iVar3 != 0) break;
      local_468 = 6;
      local_438[0].s = 1;
      local_438[0].n = 1;
      local_438[0].p = &local_468;
      iVar3 = mbedtls_mpi_add_mpi(&local_458,&local_458,local_438);
    } while (iVar3 == 0);
  }
LAB_00109630:
  if (local_458.p != (mbedtls_mpi_uint *)0x0) {
    if (local_458.n != 0) {
      sVar5 = 0;
      do {
        local_458.p[sVar5] = 0;
        sVar5 = sVar5 + 1;
      } while (local_458.n != sVar5);
    }
    free(local_458.p);
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_gen_prime( mbedtls_mpi *X, size_t nbits, int dh_flag,
                   int (*f_rng)(void *, unsigned char *, size_t),
                   void *p_rng )
{
    int ret;
    size_t k, n;
    mbedtls_mpi_uint r;
    mbedtls_mpi Y;

    if( nbits < 3 || nbits > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &Y );

    n = BITS_TO_LIMBS( nbits );

    MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( X, n * ciL, f_rng, p_rng ) );

    k = mbedtls_mpi_bitlen( X );
    if( k > nbits ) MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( X, k - nbits + 1 ) );

    mbedtls_mpi_set_bit( X, nbits-1, 1 );

    X->p[0] |= 1;

    if( dh_flag == 0 )
    {
        while( ( ret = mbedtls_mpi_is_prime( X, f_rng, p_rng ) ) != 0 )
        {
            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;

            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 2 ) );
        }
    }
    else
    {
        /*
         * An necessary condition for Y and X = 2Y + 1 to be prime
         * is X = 2 mod 3 (which is equivalent to Y = 2 mod 3).
         * Make sure it is satisfied, while keeping X = 3 mod 4
         */

        X->p[0] |= 2;

        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, 3 ) );
        if( r == 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 8 ) );
        else if( r == 1 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 4 ) );

        /* Set Y = (X-1) / 2, which is X / 2 because X is odd */
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, X ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, 1 ) );

        while( 1 )
        {
            /*
             * First, check small factors for X and Y
             * before doing Miller-Rabin on any of them
             */
            if( ( ret = mpi_check_small_factors(  X         ) ) == 0 &&
                ( ret = mpi_check_small_factors( &Y         ) ) == 0 &&
                ( ret = mpi_miller_rabin(  X, f_rng, p_rng  ) ) == 0 &&
                ( ret = mpi_miller_rabin( &Y, f_rng, p_rng  ) ) == 0 )
            {
                break;
            }

            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;

            /*
             * Next candidates. We want to preserve Y = (X-1) / 2 and
             * Y = 1 mod 2 and Y = 2 mod 3 (eq X = 3 mod 4 and X = 2 mod 3)
             * so up Y by 6 and X by 12.
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int(  X,  X, 12 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &Y, &Y, 6  ) );
        }
    }

cleanup:

    mbedtls_mpi_free( &Y );

    return( ret );
}